

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coder.cc
# Opt level: O2

void __thiscall Encoder::RemoveLast(Encoder *this,size_t N)

{
  size_t sVar1;
  S2LogMessage local_20;
  
  sVar1 = length(this);
  if (N <= sVar1) {
    this->buf_ = this->buf_ + -N;
    return;
  }
  S2LogMessage::S2LogMessage
            (&local_20,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/coding/coder.cc"
             ,0x4b,kFatal,(ostream *)&std::cerr);
  std::operator<<(local_20.stream_,"Check failed: length() >= N ");
  abort();
}

Assistant:

void Encoder::RemoveLast(size_t N) {
  S2_CHECK(length() >= N);
  buf_ -= N;
}